

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O0

char * read_file(char *filename,char *error_message,size_t message_size)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  size_t n;
  char *buffer;
  longlong len;
  FILE *fp;
  size_t message_size_local;
  char *error_message_local;
  char *filename_local;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    snprintf(error_message,message_size,"Failed to open file %s",filename);
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      sVar2 = ftell(__stream);
      iVar1 = fseek(__stream,0,0);
      if (iVar1 == 0) {
        filename_local = (char *)calloc(1,sVar2 + 10);
        if (filename_local == (char *)0x0) {
          snprintf(error_message,message_size,"out of memory");
          fclose(__stream);
          filename_local = (char *)0x0;
        }
        else {
          sVar2 = fread(filename_local,1,sVar2,__stream);
          if (sVar2 == 0) {
            snprintf(error_message,message_size,"Failed to read file");
            fclose(__stream);
            free(filename_local);
            filename_local = (char *)0x0;
          }
          else {
            fclose(__stream);
          }
        }
      }
      else {
        snprintf(error_message,message_size,"Failed to seek to file beginning");
        fclose(__stream);
        filename_local = (char *)0x0;
      }
    }
    else {
      snprintf(error_message,message_size,"Failed to seek to file end");
      fclose(__stream);
      filename_local = (char *)0x0;
    }
  }
  return filename_local;
}

Assistant:

const char* read_file(const char* filename, char* error_message, size_t message_size) {
  /* We need to use binary read on Windows to get file size correctly */
#ifdef _WIN32
  FILE* fp = fopen(filename, "rb");
#else
  FILE* fp = fopen(filename, "r");
#endif
  if (fp == NULL) {
    snprintf(error_message, message_size, "Failed to open file %s", filename);
    return NULL;
  }
  if (fseek(fp, 0, SEEK_END) != 0) {
    snprintf(error_message, message_size, "Failed to seek to file end");
    fclose(fp);
    return NULL;
  }
  long long len = ftell(fp);
  if (fseek(fp, 0, SEEK_SET) != 0) {
    snprintf(error_message, message_size, "Failed to seek to file beginning");
    fclose(fp);
    return NULL;
  }
  char* buffer = (char*)calloc(1, len + 10);
  if (!buffer) {
    snprintf(error_message, message_size, "out of memory");
    fclose(fp);
    return NULL;
  }
  size_t n = fread(buffer, 1, len, fp);
  if (n == 0) {
    snprintf(error_message, message_size, "Failed to read file");
    fclose(fp);
    free(buffer);
    return NULL;
  }
  fclose(fp);
  return buffer;
}